

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O3

void lf::io::anon_unknown_1::ValidateVtkFile(VtkFile *vtk_file)

{
  ulong __n;
  pointer pvVar1;
  pointer pvVar2;
  size_type sVar3;
  type *ptVar4;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 *puVar7;
  pointer pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  type *ptVar10;
  undefined8 local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_e8;
  long *local_d0 [2];
  long local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  uint *local_90;
  undefined8 local_88;
  uint local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  uint *local_70;
  undefined8 local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  uint *local_50;
  undefined8 local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  __n = (vtk_file->header)._M_string_length;
  if (__n != 0) {
    pcVar8 = (vtk_file->header)._M_dataplus._M_p;
    pvVar5 = memchr(pcVar8,10,__n);
    if ((long)pvVar5 - (long)pcVar8 != -1 && pvVar5 != (void *)0x0) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Header of vtk file contains a new line character, this is not allowed","");
      *puVar7 = &PTR__LfException_005192c8;
      puVar7[1] = puVar7 + 3;
      if (local_50 == &local_40) {
        *(uint *)(puVar7 + 3) = local_40;
        *(undefined4 *)((long)puVar7 + 0x1c) = uStack_3c;
        *(undefined4 *)(puVar7 + 4) = uStack_38;
        *(undefined4 *)((long)puVar7 + 0x24) = uStack_34;
      }
      else {
        puVar7[1] = local_50;
        puVar7[3] = CONCAT44(uStack_3c,local_40);
      }
      puVar7[2] = local_48;
      local_48 = 0;
      local_40 = local_40 & 0xffffff00;
      local_50 = &local_40;
      __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
    }
    if (0x100 < __n) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Header of vtk file is longer than 256 characters","");
      *puVar7 = &PTR__LfException_005192c8;
      puVar7[1] = puVar7 + 3;
      if (local_70 == &local_60) {
        *(uint *)(puVar7 + 3) = local_60;
        *(undefined4 *)((long)puVar7 + 0x1c) = uStack_5c;
        *(undefined4 *)(puVar7 + 4) = uStack_58;
        *(undefined4 *)((long)puVar7 + 0x24) = uStack_54;
      }
      else {
        puVar7[1] = local_70;
        puVar7[3] = CONCAT44(uStack_5c,local_60);
      }
      puVar7[2] = local_68;
      local_68 = 0;
      local_60 = local_60 & 0xffffff00;
      local_70 = &local_60;
      __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
    }
  }
  if ((long)(vtk_file->unstructured_grid).cell_types.
            super__Vector_base<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(vtk_file->unstructured_grid).cell_types.
            super__Vector_base<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>
            ._M_impl.super__Vector_impl_data._M_start >> 2 !=
      ((long)(vtk_file->unstructured_grid).cells.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(vtk_file->unstructured_grid).cells.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Mismatch of size of cell_types and cells in VtkFile.","");
    *puVar7 = &PTR__LfException_005192c8;
    puVar7[1] = puVar7 + 3;
    if (local_90 == &local_80) {
      *(uint *)(puVar7 + 3) = local_80;
      *(undefined4 *)((long)puVar7 + 0x1c) = uStack_7c;
      *(undefined4 *)(puVar7 + 4) = uStack_78;
      *(undefined4 *)((long)puVar7 + 0x24) = uStack_74;
    }
    else {
      puVar7[1] = local_90;
      puVar7[3] = CONCAT44(uStack_7c,local_80);
    }
    puVar7[2] = local_88;
    local_88 = 0;
    local_80 = local_80 & 0xffffff00;
    local_90 = &local_80;
    __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
  }
  pvVar1 = (vtk_file->point_data).
           super__Vector_base<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (vtk_file->point_data).
           super__Vector_base<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar1 != pvVar2) {
    paVar9 = &local_108.field_2;
    ptVar10 = &(pvVar1->storage_).super_aligned_storage_imp<88UL,_8UL>.data_.align_ + 4;
    do {
      switch((int)*(uint *)(ptVar10 + -5) >> 0x1f ^ *(uint *)(ptVar10 + -5)) {
      case 0:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_e8,
                   (vector<char,_std::allocator<char>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 1:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 2:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<short,_std::allocator<short>_>::vector
                  ((vector<short,_std::allocator<short>_> *)&local_e8,
                   (vector<short,_std::allocator<short>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 1 !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 3:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_e8,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 1 !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 4:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_e8,
                   (vector<int,_std::allocator<int>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2 !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 5:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2 !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 6:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_e8,
                   (vector<long,_std::allocator<long>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 7:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 8:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_e8,
                   (vector<float,_std::allocator<float>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2 !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 9:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_e8,
                   (vector<double,_std::allocator<double>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 !=
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 10:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::
        vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)&local_e8,
                 (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)ptVar10);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)(vtk_file->unstructured_grid).points.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(vtk_file->unstructured_grid).points.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        goto LAB_00345938;
      case 0xb:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector(&local_e8,
                 (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)ptVar10);
        if (((long)local_e8.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
            ((long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).points.
                   super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x5555555555555555 != 0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of points.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        goto LAB_00345938;
      default:
        goto switchD_003453b8_caseD_c;
      }
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
LAB_00345938:
      if (local_e8.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar9) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      ptVar4 = ptVar10 + 7;
      ptVar10 = ptVar10 + 0xc;
    } while ((pointer)ptVar4 != pvVar2);
  }
  pvVar1 = (vtk_file->cell_data).
           super__Vector_base<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (vtk_file->cell_data).
           super__Vector_base<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar1 != pvVar2) {
    paVar9 = &local_108.field_2;
    ptVar10 = &(pvVar1->storage_).super_aligned_storage_imp<88UL,_8UL>.data_.align_ + 4;
    do {
      switch((int)*(uint *)(ptVar10 + -5) >> 0x1f ^ *(uint *)(ptVar10 + -5)) {
      case 0:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_e8,
                   (vector<char,_std::allocator<char>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 1:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 2:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<short,_std::allocator<short>_>::vector
                  ((vector<short,_std::allocator<short>_> *)&local_e8,
                   (vector<short,_std::allocator<short>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 1 !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 3:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_e8,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 1 !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 4:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_e8,
                   (vector<int,_std::allocator<int>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2 !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 5:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2 !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 6:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_e8,
                   (vector<long,_std::allocator<long>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 7:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 8:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_e8,
                   (vector<float,_std::allocator<float>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2 !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 9:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_e8,
                   (vector<double,_std::allocator<double>_> *)ptVar10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,*(long *)&ptVar10[3].field_0x0,
                   (long)ptVar10[4] + *(long *)&ptVar10[3].field_0x0);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 !=
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        break;
      case 10:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::
        vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)&local_e8,
                 (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)ptVar10);
        if (((long)local_e8.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 +
            ((long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(vtk_file->unstructured_grid).cells.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x5555555555555555 != 0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        goto LAB_00345f3d;
      case 0xb:
        local_108._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,ptVar10[-4],
                   (long)ptVar10[-4] + *(long *)&ptVar10[-3].field_0x0);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector(&local_e8,
                 (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)ptVar10);
        if ((long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)(vtk_file->unstructured_grid).cells.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(vtk_file->unstructured_grid).cells.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
          std::operator+(&local_b0,"Length of dataset ",&local_108);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," does not match the number of cells.");
          pcVar8 = (pbVar6->_M_dataplus)._M_p;
          paVar9 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 == paVar9) {
            local_118 = paVar9->_M_allocated_capacity;
            uStack_110 = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            uStack_10c = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            pcVar8 = (pointer)&local_118;
          }
          else {
            local_118 = paVar9->_M_allocated_capacity;
          }
          sVar3 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          *puVar7 = &PTR__LfException_005192c8;
          puVar7[1] = puVar7 + 3;
          if (pcVar8 == (pointer)&local_118) {
            *(undefined4 *)(puVar7 + 3) = (undefined4)local_118;
            *(undefined4 *)((long)puVar7 + 0x1c) = local_118._4_4_;
            *(undefined4 *)(puVar7 + 4) = uStack_110;
            *(undefined4 *)((long)puVar7 + 0x24) = uStack_10c;
          }
          else {
            puVar7[1] = pcVar8;
            puVar7[3] = local_118;
          }
          puVar7[2] = sVar3;
          local_118 = local_118 & 0xffffffffffffff00;
          __cxa_throw(puVar7,&base::LfException::typeinfo,base::LfException::~LfException);
        }
        goto LAB_00345f3d;
      default:
switchD_003453b8_caseD_c:
        boost::detail::variant::forced_return<void>();
      }
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
LAB_00345f3d:
      if (local_e8.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar9) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      ptVar4 = ptVar10 + 7;
      ptVar10 = ptVar10 + 0xc;
    } while ((pointer)ptVar4 != pvVar2);
  }
  return;
}

Assistant:

void ValidateVtkFile(const VtkFile& vtk_file) {
  // check that header doesn't contain a new line character:
  if (vtk_file.header.find('\n') != std::string::npos) {
    throw base::LfException(
        "Header of vtk file contains a new line character, this is not "
        "allowed");
  }
  if (vtk_file.header.size() > 256) {
    throw base::LfException("Header of vtk file is longer than 256 characters");
  }
  if (vtk_file.unstructured_grid.cell_types.size() !=
      vtk_file.unstructured_grid.cells.size()) {
    throw base::LfException(
        "Mismatch of size of cell_types and cells in VtkFile.");
  }
  for (const auto& d : vtk_file.point_data) {
    boost::apply_visitor(
        [&](auto e) {
          if (e.data.size() != vtk_file.unstructured_grid.points.size()) {
            throw base::LfException("Length of dataset " + e.name +
                                    " does not match the number of points.");
          }
        },
        d);
  }
  for (const auto& d : vtk_file.cell_data) {
    boost::apply_visitor(
        [&](auto e) {
          if (e.data.size() != vtk_file.unstructured_grid.cells.size()) {
            throw base::LfException("Length of dataset " + e.name +
                                    " does not match the number of cells.");
          }
        },
        d);
  }
}